

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this,cmGeneratorTarget *target)

{
  string *config;
  cmOSXBundleGenerator *this_00;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator)._vptr_cmMakefileTargetGenerator =
       (_func_int **)&PTR__cmMakefileExecutableTargetGenerator_006c3320;
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  config = &(this->super_cmMakefileTargetGenerator).ConfigName;
  cmTarget::GetExecutableNames
            ((this->super_cmMakefileTargetGenerator).Target,
             &(this->super_cmMakefileTargetGenerator).TargetNameOut,
             &(this->super_cmMakefileTargetGenerator).TargetNameReal,
             &(this->super_cmMakefileTargetGenerator).TargetNameImport,
             &(this->super_cmMakefileTargetGenerator).TargetNamePDB,config);
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target,config);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_00;
  this_00->MacContentFolders = &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator
::cmMakefileExecutableTargetGenerator(cmGeneratorTarget* target):
  cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  this->Target->GetExecutableNames(
    this->TargetNameOut, this->TargetNameReal, this->TargetNameImport,
    this->TargetNamePDB, this->ConfigName);

  this->OSXBundleGenerator = new cmOSXBundleGenerator(target,
                                                      this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}